

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Variable_connectionId_Test::TestBody(Variable_connectionId_Test *this)

{
  char *pcVar1;
  AssertHelper aAStack_68 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  VariablePtr v2;
  VariablePtr v1;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence((shared_ptr *)&v1,(shared_ptr *)&v2);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_((shared_ptr *)&local_50,(shared_ptr *)&v1)
  ;
  pcVar1 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","libcellml::Variable::equivalenceConnectionId(v1, v2)",
             (char (*) [1])0x11505a,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"connection_id",(allocator<char> *)&gtest_ar);
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&v1,(shared_ptr *)&v2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_((shared_ptr *)&local_50,(shared_ptr *)&v1)
  ;
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"connection_id\"",
             "libcellml::Variable::equivalenceConnectionId(v1, v2)",(char (*) [14])"connection_id",
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, connectionId)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);

    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(v1, v2));

    libcellml::Variable::setEquivalenceConnectionId(v1, v2, "connection_id");
    EXPECT_EQ("connection_id", libcellml::Variable::equivalenceConnectionId(v1, v2));
}